

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_mident_metrics_tmpl<2,2>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *v2m,bool has_degen)

{
  Alloc *pAVar1;
  int n;
  void *extraout_RDX;
  size_t sVar2;
  Reals RVar3;
  LOs ev2v;
  Write<double> out;
  Write<signed_char> local_88;
  type f;
  
  pAVar1 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",(allocator *)&ev2v);
  n = (int)(sVar2 >> 2);
  Write<double>::Write(&out,n * 3,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
  Write<int>::Write((Write<int> *)&f,&a2e->write_);
  Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
  Write<double>::Write(&f.v2m.write_,&v2m->write_);
  f.has_degen = has_degen;
  Write<double>::Write(&f.out,&out);
  parallel_for<Omega_h::get_mident_metrics_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,bool)::_lambda(int)_1_>
            (n,&f,"get_mident_metrics");
  Write<double>::Write(&local_88,(Write<signed_char> *)&out);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_88);
  Write<double>::~Write((Write<double> *)&local_88);
  get_mident_metrics_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,bool)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
  Write<int>::~Write(&ev2v.write_);
  Write<double>::~Write(&out);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics_tmpl(
    Mesh* mesh, LOs a2e, Reals v2m, bool has_degen) {
  auto na = a2e.size();
  Write<Real> out(na * symm_ncomps(mdim));
  auto ev2v = mesh->ask_verts_of(edim);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    auto ms = gather_symms<edim + 1, mdim>(v2m, v);
    auto m = average_metric(ms, has_degen);
    set_symm(out, a, m);
  };
  parallel_for(na, f, "get_mident_metrics");
  return out;
}